

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

PCWSTR __thiscall
Js::DebuggerScope::GetDebuggerScopeTypeString(DebuggerScope *this,DiagExtraScopesType scopeType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DiagExtraScopesType scopeType_local;
  DebuggerScope *this_local;
  
  switch(scopeType) {
  case DiagUnknownScope:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccdaa4;
    break;
  case DiagWithScope:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccdabd;
    break;
  case DiagCatchScopeDirect:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccda7d;
    break;
  case DiagCatchScopeInSlot:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccda97;
    break;
  case DiagCatchScopeInObject:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccda8a;
    break;
  case DiagBlockScopeDirect:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccda3d;
    break;
  case DiagBlockScopeInSlot:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccda63;
    break;
  case DiagBlockScopeInObject:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccda4a;
    break;
  case DiagBlockScopeRangeEnd:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccda70;
    break;
  case DiagParamScope:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccdad6;
    break;
  case DiagParamScopeInObject:
    this_local = (DebuggerScope *)anon_var_dwarf_1ccdae3;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x16c6,"(false)","Missing a debug scope type.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local = (DebuggerScope *)0x180ca08;
  }
  return (PCWSTR)this_local;
}

Assistant:

PCWSTR DebuggerScope::GetDebuggerScopeTypeString(DiagExtraScopesType scopeType)
    {
        switch (scopeType)
        {
        case DiagExtraScopesType::DiagBlockScopeDirect:
            return _u("DiagBlockScopeDirect");
        case DiagExtraScopesType::DiagBlockScopeInObject:
            return _u("DiagBlockScopeInObject");
        case DiagExtraScopesType::DiagBlockScopeInSlot:
            return _u("DiagBlockScopeInSlot");
        case DiagExtraScopesType::DiagBlockScopeRangeEnd:
            return _u("DiagBlockScopeRangeEnd");
        case DiagExtraScopesType::DiagCatchScopeDirect:
            return _u("DiagCatchScopeDirect");
        case DiagExtraScopesType::DiagCatchScopeInObject:
            return _u("DiagCatchScopeInObject");
        case DiagExtraScopesType::DiagCatchScopeInSlot:
            return _u("DiagCatchScopeInSlot");
        case DiagExtraScopesType::DiagUnknownScope:
            return _u("DiagUnknownScope");
        case DiagExtraScopesType::DiagWithScope:
            return _u("DiagWithScope");
        case DiagExtraScopesType::DiagParamScope:
            return _u("DiagParamScope");
        case DiagExtraScopesType::DiagParamScopeInObject:
            return _u("DiagParamScopeInObject");
        default:
            AssertMsg(false, "Missing a debug scope type.");
            return _u("");
        }
    }